

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O0

void __thiscall IntVarSL::channel(IntVarSL *this,int val,LitRel val_type,int sign)

{
  uint uVar1;
  int in_ECX;
  int iVar2;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  LitRel type;
  int o;
  
  iVar2 = in_EDX * 3;
  o = in_ECX;
  IntVar::set(&this->super_IntVar,val,val_type,sign._3_1_);
  if (iVar2 == in_ECX) {
    vec<int>::operator[]((vec<int> *)(in_RDI + 0x60),in_ESI);
    Tchar::operator=((Tchar *)CONCAT44(in_ESI,in_EDX),(char)((uint)o >> 0x18));
  }
  uVar1 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0x70) + 0xc));
  vec<int>::operator[]((vec<int> *)(in_RDI + 0x60),uVar1);
  Tint::operator=((Tint *)CONCAT44(in_ESI,in_EDX),o);
  uVar1 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0x70) + 0x10));
  vec<int>::operator[]((vec<int> *)(in_RDI + 0x60),uVar1);
  Tint::operator=((Tint *)CONCAT44(in_ESI,in_EDX),o);
  return;
}

Assistant:

void IntVarSL::channel(int val, LitRel val_type, int sign) {
	//	fprintf(stderr, "funny channel\n");
	auto type = static_cast<LitRel>(static_cast<int>(val_type) * 3 ^ sign);
	el->set(val, type, false);
	if (type == 0) {
		vals[values[val]] = 0;
	}
	min = values[el->min];
	max = values[el->max];
}